

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O2

void __thiscall ipx::Basis::SolveForUpdate(Basis *this,Int j)

{
  int iVar1;
  Model *pMVar2;
  pointer piVar3;
  Int p;
  double dVar4;
  long lStack_30;
  Timer timer;
  
  p = PositionOf(this,j);
  Timer::Timer(&timer);
  if (p < 0) {
    pMVar2 = this->model_;
    piVar3 = (pMVar2->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar3[j];
    LuUpdate::FtranForUpdate
              ((this->lu_)._M_t.
               super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
               super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
               super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,
               piVar3[(long)j + 1] - iVar1,
               (pMVar2->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + iVar1,
               (pMVar2->AI_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar1);
    lStack_30 = 0x68;
  }
  else {
    LuUpdate::BtranForUpdate
              ((this->lu_)._M_t.
               super___uniq_ptr_impl<ipx::LuUpdate,_std::default_delete<ipx::LuUpdate>_>._M_t.
               super__Tuple_impl<0UL,_ipx::LuUpdate_*,_std::default_delete<ipx::LuUpdate>_>.
               super__Head_base<0UL,_ipx::LuUpdate_*,_false>._M_head_impl,p);
    lStack_30 = 0x70;
  }
  dVar4 = Timer::Elapsed(&timer);
  *(double *)((long)&this->control_ + lStack_30) =
       dVar4 + *(double *)((long)&this->control_ + lStack_30);
  return;
}

Assistant:

void Basis::SolveForUpdate(Int j) {
    const Int p = PositionOf(j);
    Timer timer;
    if (p < 0) {
        const SparseMatrix& AI = model_.AI();
        Int begin = AI.begin(j);
        Int end = AI.end(j);
        Int nz = end-begin;
        const Int* bi = AI.rowidx() + begin;
        const double* bx = AI.values() + begin;
        lu_->FtranForUpdate(nz, bi, bx);
        time_ftran_ += timer.Elapsed();
    }
    else {
        lu_->BtranForUpdate(p);
        time_btran_ += timer.Elapsed();
    }
}